

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O0

void __thiscall TEST_TestFailure_FailFailure_Test::testBody(TEST_TestFailure_FailFailure_Test *this)

{
  undefined *fileName;
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  undefined1 local_a8 [56];
  FailFailure f;
  TEST_TestFailure_FailFailure_Test *this_local;
  
  fileName = (anonymous_namespace)::failFileName;
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  f.super_TestFailure.message_.bufferSize_ = (size_t)this;
  SimpleString::SimpleString((SimpleString *)(local_a8 + 0x20),"chk");
  FailFailure::FailFailure
            ((FailFailure *)(local_a8 + 0x30),pUVar1,fileName,2,(SimpleString *)(local_a8 + 0x20));
  SimpleString::~SimpleString((SimpleString *)(local_a8 + 0x20));
  pUVar1 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_a8);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_a8);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,"chk",pcVar2,"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
             ,0x7e,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_a8);
  FailFailure::~FailFailure((FailFailure *)(local_a8 + 0x30));
  return;
}

Assistant:

TEST(TestFailure, FailFailure)
{
    FailFailure f(test, failFileName, failLineNumber, "chk");
    FAILURE_EQUAL("chk", f);
}